

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int base64_decode_tail_using_maps(base64_maps_t *maps,char *dest,char *src,size_t srclen)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  size_t local_40;
  size_t insize;
  int quartet_result;
  char longsrc [4];
  size_t srclen_local;
  char *src_local;
  char *dest_local;
  base64_maps_t *maps_local;
  
  local_40 = srclen;
  while( true ) {
    bVar3 = false;
    if (local_40 != 0) {
      bVar3 = src[local_40 - 1] == '=';
    }
    if (!bVar3) break;
    local_40 = local_40 - 1;
  }
  if (local_40 == 0) {
    maps_local._4_4_ = 0;
  }
  else {
    _quartet_result = srclen;
    if (local_40 == 1) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      maps_local._4_4_ = -1;
    }
    else {
      memcpy((void *)((long)&insize + 4),src,local_40);
      memset((void *)((long)&insize + local_40 + 4),0x41,4 - local_40);
      iVar1 = base64_decode_quartet_using_maps(maps,dest,(char *)((long)&insize + 4));
      if (iVar1 == -1) {
        maps_local._4_4_ = -1;
      }
      else {
        maps_local._4_4_ = (int)local_40 + -1;
      }
    }
  }
  return maps_local._4_4_;
}

Assistant:

int base64_decode_tail_using_maps(const base64_maps_t *maps, char dest[3],
				  const char * src, const size_t srclen)
{
	char longsrc[4];
	int quartet_result;
	size_t insize = srclen;

	while (insize != 0 &&
	       src[insize-1] == '=') { /* throw away padding symbols */
		insize--;
	}
	if (insize == 0) {
		return 0;
	}
	if (insize == 1) {
		/* the input is malformed.... */
		errno = EINVAL;
		return -1;
	}
	memcpy(longsrc, src, insize);
	memset(longsrc+insize, 'A', 4-insize);
	quartet_result = base64_decode_quartet_using_maps(maps, dest, longsrc);
	if (quartet_result == -1) {
		return -1;
	}

	return insize - 1;
}